

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkFlow.c
# Opt level: O0

void Nwk_ObjSetVisitedBot(Nwk_Obj_t *pObj)

{
  Nwk_Obj_t *pObj_local;
  
  if (pObj->TravId < pObj->pMan->nTravIds + -2) {
    pObj->TravId = pObj->pMan->nTravIds + -2;
  }
  else {
    if (pObj->TravId != pObj->pMan->nTravIds + -1) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/nwk/nwkFlow.c"
                    ,0x49,"void Nwk_ObjSetVisitedBot(Nwk_Obj_t *)");
    }
    pObj->TravId = pObj->pMan->nTravIds;
  }
  return;
}

Assistant:

static inline void Nwk_ObjSetVisitedBot( Nwk_Obj_t * pObj )  
{
    if ( pObj->TravId < pObj->pMan->nTravIds - 2 )
        pObj->TravId = pObj->pMan->nTravIds - 2;
    else if ( pObj->TravId == pObj->pMan->nTravIds - 1 )
        pObj->TravId = pObj->pMan->nTravIds;
    else
        assert( 0 );
}